

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O0

bool __thiscall
OpenMesh::IO::_PLYReader_::read_binary
          (_PLYReader_ *this,istream *_in,BaseImporter *_bi,bool param_3,Options *_opt)

{
  ValueType VVar1;
  BaseImporter *pBVar2;
  bool bVar3;
  mostream *pmVar4;
  float *pfVar5;
  int *piVar6;
  mapped_type *pmVar7;
  mapped_type_conflict *pmVar8;
  reference pvVar9;
  float fVar10;
  byte local_151;
  VertexHandle local_140;
  BaseHandle local_13c;
  BaseHandle local_138;
  BaseHandle local_134;
  VectorT<unsigned_char,_4> local_130;
  BaseHandle local_12c;
  BaseHandle local_128;
  BaseHandle local_124;
  uint local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  float local_b0;
  uint propertyIndex;
  float tmp;
  Vec4i c;
  VertexHandle local_8c;
  undefined1 local_88 [4];
  VertexHandle vh;
  VHandles vhandles;
  Vec2f t;
  Vec3f n;
  Vec3f v;
  uint nV;
  uint idx;
  uint l;
  uint k;
  uint j;
  uint i;
  Options *_opt_local;
  BaseImporter *pBStack_28;
  bool param_3_local;
  BaseImporter *_bi_local;
  istream *_in_local;
  _PLYReader_ *this_local;
  
  _j = _opt;
  _opt_local._7_1_ = param_3;
  pBStack_28 = _bi;
  _bi_local = (BaseImporter *)_in;
  _in_local = (istream *)this;
  bVar3 = can_u_read(this,_in);
  if (bVar3) {
    VectorT<float,_3>::VectorT((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1));
    VectorT<float,_3>::VectorT((VectorT<float,_3> *)&t);
    VectorT<float,_2>::VectorT
              ((VectorT<float,_2> *)
               &vhandles.
                super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::vector
              ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_88);
    VertexHandle::VertexHandle(&local_8c,-1);
    VectorT<int,_4>::VectorT((VectorT<int,_4> *)&propertyIndex);
    (*pBStack_28->_vptr_BaseImporter[0x1b])
              (pBStack_28,(ulong)this->vertexCount_,(ulong)(this->vertexCount_ * 3),
               (ulong)this->faceCount_);
    k = 0;
    while( true ) {
      local_151 = 0;
      if (k < this->vertexCount_) {
        local_151 = std::ios::eof();
        local_151 = local_151 ^ 0xff;
      }
      if ((local_151 & 1) == 0) break;
      pfVar5 = VectorT<float,_3>::operator[]
                         ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),0);
      *pfVar5 = 0.0;
      pfVar5 = VectorT<float,_3>::operator[]
                         ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),1);
      *pfVar5 = 0.0;
      pfVar5 = VectorT<float,_3>::operator[]
                         ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),2);
      *pfVar5 = 0.0;
      pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)&t,0);
      *pfVar5 = 0.0;
      pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)&t,1);
      *pfVar5 = 0.0;
      pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)&t,2);
      *pfVar5 = 0.0;
      pfVar5 = VectorT<float,_2>::operator[]
                         ((VectorT<float,_2> *)
                          &vhandles.
                           super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
      *pfVar5 = 0.0;
      pfVar5 = VectorT<float,_2>::operator[]
                         ((VectorT<float,_2> *)
                          &vhandles.
                           super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
      *pfVar5 = 0.0;
      piVar6 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)&propertyIndex,0);
      *piVar6 = 0;
      piVar6 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)&propertyIndex,1);
      *piVar6 = 0;
      piVar6 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)&propertyIndex,2);
      *piVar6 = 0;
      piVar6 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)&propertyIndex,3);
      *piVar6 = 0xff;
      for (local_b4 = 0; local_b4 < this->vertexPropertyCount_; local_b4 = local_b4 + 1) {
        local_b8 = local_b4;
        pmVar7 = std::
                 map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                 ::operator[](&this->vertexPropertyMap_,(key_type *)&local_b8);
        pBVar2 = _bi_local;
        switch(pmVar7->property) {
        case XCOORD:
          local_bc = local_b4;
          pmVar7 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](&this->vertexPropertyMap_,(key_type *)&local_bc);
          pBVar2 = _bi_local;
          VVar1 = pmVar7->value;
          pfVar5 = VectorT<float,_3>::operator[]
                             ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),0);
          readValue(this,VVar1,(istream *)pBVar2,pfVar5);
          break;
        case YCOORD:
          local_c0 = local_b4;
          pmVar7 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](&this->vertexPropertyMap_,(key_type *)&local_c0);
          pBVar2 = _bi_local;
          VVar1 = pmVar7->value;
          pfVar5 = VectorT<float,_3>::operator[]
                             ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),1);
          readValue(this,VVar1,(istream *)pBVar2,pfVar5);
          break;
        case ZCOORD:
          local_c4 = local_b4;
          pmVar7 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](&this->vertexPropertyMap_,(key_type *)&local_c4);
          pBVar2 = _bi_local;
          VVar1 = pmVar7->value;
          pfVar5 = VectorT<float,_3>::operator[]
                             ((VectorT<float,_3> *)(n.super_VectorDataT<float,_3>.values_ + 1),2);
          readValue(this,VVar1,(istream *)pBVar2,pfVar5);
          break;
        case TEXX:
          local_d4 = local_b4;
          pmVar7 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](&this->vertexPropertyMap_,(key_type *)&local_d4);
          pBVar2 = _bi_local;
          VVar1 = pmVar7->value;
          pfVar5 = VectorT<float,_2>::operator[]
                             ((VectorT<float,_2> *)
                              &vhandles.
                               super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
          readValue(this,VVar1,(istream *)pBVar2,pfVar5);
          break;
        case TEXY:
          local_d8 = local_b4;
          pmVar7 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](&this->vertexPropertyMap_,(key_type *)&local_d8);
          pBVar2 = _bi_local;
          VVar1 = pmVar7->value;
          pfVar5 = VectorT<float,_2>::operator[]
                             ((VectorT<float,_2> *)
                              &vhandles.
                               super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
          readValue(this,VVar1,(istream *)pBVar2,pfVar5);
          break;
        case COLORRED:
          local_dc = local_b4;
          pmVar7 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](&this->vertexPropertyMap_,(key_type *)&local_dc);
          bVar3 = true;
          if (pmVar7->value != ValueTypeFLOAT32) {
            local_e0 = local_b4;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_e0);
            bVar3 = pmVar7->value == ValueTypeFLOAT;
          }
          if (bVar3) {
            local_e4 = local_b4;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_e4);
            readValue(this,pmVar7->value,(istream *)_bi_local,&local_b0);
            fVar10 = local_b0 * 255.0;
            piVar6 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)&propertyIndex,0);
            *piVar6 = (int)fVar10;
          }
          else {
            local_e8 = local_b4;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_e8);
            pBVar2 = _bi_local;
            VVar1 = pmVar7->value;
            piVar6 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)&propertyIndex,0);
            readInteger(this,VVar1,(istream *)pBVar2,piVar6);
          }
          break;
        case COLORGREEN:
          local_ec = local_b4;
          pmVar7 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](&this->vertexPropertyMap_,(key_type *)&local_ec);
          bVar3 = true;
          if (pmVar7->value != ValueTypeFLOAT32) {
            local_f0 = local_b4;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_f0);
            bVar3 = pmVar7->value == ValueTypeFLOAT;
          }
          if (bVar3) {
            local_f4 = local_b4;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_f4);
            readValue(this,pmVar7->value,(istream *)_bi_local,&local_b0);
            fVar10 = local_b0 * 255.0;
            piVar6 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)&propertyIndex,1);
            *piVar6 = (int)fVar10;
          }
          else {
            local_f8 = local_b4;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_f8);
            pBVar2 = _bi_local;
            VVar1 = pmVar7->value;
            piVar6 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)&propertyIndex,1);
            readInteger(this,VVar1,(istream *)pBVar2,piVar6);
          }
          break;
        case COLORBLUE:
          local_fc = local_b4;
          pmVar7 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](&this->vertexPropertyMap_,(key_type *)&local_fc);
          bVar3 = true;
          if (pmVar7->value != ValueTypeFLOAT32) {
            local_100 = local_b4;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_100);
            bVar3 = pmVar7->value == ValueTypeFLOAT;
          }
          if (bVar3) {
            local_104 = local_b4;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_104);
            readValue(this,pmVar7->value,(istream *)_bi_local,&local_b0);
            fVar10 = local_b0 * 255.0;
            piVar6 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)&propertyIndex,2);
            *piVar6 = (int)fVar10;
          }
          else {
            local_108 = local_b4;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_108);
            pBVar2 = _bi_local;
            VVar1 = pmVar7->value;
            piVar6 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)&propertyIndex,2);
            readInteger(this,VVar1,(istream *)pBVar2,piVar6);
          }
          break;
        case COLORALPHA:
          local_10c = local_b4;
          pmVar7 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](&this->vertexPropertyMap_,(key_type *)&local_10c);
          bVar3 = true;
          if (pmVar7->value != ValueTypeFLOAT32) {
            local_110 = local_b4;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_110);
            bVar3 = pmVar7->value == ValueTypeFLOAT;
          }
          if (bVar3) {
            local_114 = local_b4;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_114);
            readValue(this,pmVar7->value,(istream *)_bi_local,&local_b0);
            fVar10 = local_b0 * 255.0;
            piVar6 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)&propertyIndex,3);
            *piVar6 = (int)fVar10;
          }
          else {
            local_118 = local_b4;
            pmVar7 = std::
                     map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                     ::operator[](&this->vertexPropertyMap_,(key_type *)&local_118);
            pBVar2 = _bi_local;
            VVar1 = pmVar7->value;
            piVar6 = VectorT<int,_4>::operator[]((VectorT<int,_4> *)&propertyIndex,3);
            readInteger(this,VVar1,(istream *)pBVar2,piVar6);
          }
          break;
        case XNORM:
          local_c8 = local_b4;
          pmVar7 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](&this->vertexPropertyMap_,(key_type *)&local_c8);
          pBVar2 = _bi_local;
          VVar1 = pmVar7->value;
          pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)&t,0);
          readValue(this,VVar1,(istream *)pBVar2,pfVar5);
          break;
        case YNORM:
          local_cc = local_b4;
          pmVar7 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](&this->vertexPropertyMap_,(key_type *)&local_cc);
          pBVar2 = _bi_local;
          VVar1 = pmVar7->value;
          pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)&t,1);
          readValue(this,VVar1,(istream *)pBVar2,pfVar5);
          break;
        case ZNORM:
          local_d0 = local_b4;
          pmVar7 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](&this->vertexPropertyMap_,(key_type *)&local_d0);
          pBVar2 = _bi_local;
          VVar1 = pmVar7->value;
          pfVar5 = VectorT<float,_3>::operator[]((VectorT<float,_3> *)&t,2);
          readValue(this,VVar1,(istream *)pBVar2,pfVar5);
          break;
        default:
          local_11c = local_b4;
          pmVar7 = std::
                   map<int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMesh::IO::_PLYReader_::VertexPropertyInfo>_>_>
                   ::operator[](&this->vertexPropertyMap_,(key_type *)&local_11c);
          pmVar8 = std::
                   map<OpenMesh::IO::_PLYReader_::ValueType,_int,_std::less<OpenMesh::IO::_PLYReader_::ValueType>,_std::allocator<std::pair<const_OpenMesh::IO::_PLYReader_::ValueType,_int>_>_>
                   ::operator[](&this->scalar_size_,&pmVar7->value);
          consume_input(this,(istream *)pBVar2,*pmVar8);
        }
      }
      local_120 = (*pBStack_28->_vptr_BaseImporter[2])
                            (pBStack_28,n.super_VectorDataT<float,_3>.values_ + 1);
      local_8c.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)local_120;
      bVar3 = Options::vertex_has_normal(_j);
      if (bVar3) {
        local_124 = local_8c.super_BaseHandle.idx_;
        (*pBStack_28->_vptr_BaseImporter[8])
                  (pBStack_28,(ulong)(uint)local_8c.super_BaseHandle.idx_,&t);
      }
      bVar3 = Options::vertex_has_texcoord(_j);
      if (bVar3) {
        local_128 = local_8c.super_BaseHandle.idx_;
        (*pBStack_28->_vptr_BaseImporter[0xd])
                  (pBStack_28,(ulong)(uint)local_8c.super_BaseHandle.idx_,
                   &vhandles.
                    super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      bVar3 = Options::vertex_has_color(_j);
      pBVar2 = pBStack_28;
      if (bVar3) {
        local_12c = local_8c.super_BaseHandle.idx_;
        VectorT<unsigned_char,_4>::VectorT<int>(&local_130,(VectorT<int,_4> *)&propertyIndex);
        (*pBVar2->_vptr_BaseImporter[10])(pBVar2,(ulong)(uint)local_12c.idx_,&local_130);
      }
      k = k + 1;
    }
    for (k = 0; k < this->faceCount_; k = k + 1) {
      readValue(this,this->faceIndexType_,(istream *)_bi_local,
                (uint *)(v.super_VectorDataT<float,_3>.values_ + 1));
      if (v.super_VectorDataT<float,_3>.values_[1] == 4.2039e-45) {
        std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::resize
                  ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                   local_88,3);
        readInteger(this,this->faceEntryType_,(istream *)_bi_local,&l);
        readInteger(this,this->faceEntryType_,(istream *)_bi_local,&idx);
        readInteger(this,this->faceEntryType_,(istream *)_bi_local,&nV);
        VertexHandle::VertexHandle((VertexHandle *)&local_134,l);
        pvVar9 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
                 operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                             *)local_88,0);
        (pvVar9->super_BaseHandle).idx_ = local_134.idx_;
        VertexHandle::VertexHandle((VertexHandle *)&local_138,idx);
        pvVar9 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
                 operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                             *)local_88,1);
        (pvVar9->super_BaseHandle).idx_ = local_138.idx_;
        VertexHandle::VertexHandle((VertexHandle *)&local_13c,nV);
        pvVar9 = std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
                 operator[]((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                             *)local_88,2);
        (pvVar9->super_BaseHandle).idx_ = local_13c.idx_;
      }
      else {
        std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::clear
                  ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                   local_88);
        for (l = 0; l < (uint)v.super_VectorDataT<float,_3>.values_[1]; l = l + 1) {
          readInteger(this,this->faceEntryType_,(istream *)_bi_local,
                      (uint *)(v.super_VectorDataT<float,_3>.values_ + 2));
          VertexHandle::VertexHandle(&local_140,(int)v.super_VectorDataT<float,_3>.values_[2]);
          std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::push_back
                    ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                     local_88,&local_140);
        }
      }
      (*pBStack_28->_vptr_BaseImporter[4])(pBStack_28,local_88);
    }
    this_local._7_1_ = 1;
    std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::~vector
              ((vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)local_88);
  }
  else {
    pmVar4 = omerr();
    std::operator<<(&pmVar4->super_ostream,"[PLYReader] : Unable to parse header\n");
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool _PLYReader_::read_binary(std::istream& _in, BaseImporter& _bi, bool /*_swap*/, const Options& _opt) const {

    // Reparse the header
    if (!can_u_read(_in)) {
        omerr() << "[PLYReader] : Unable to parse header\n";
        return false;
    }

    unsigned int i, j, k, l, idx;
    unsigned int nV;
    OpenMesh::Vec3f        v, n;  // Vertex
    OpenMesh::Vec2f        t;  // TexCoords
    BaseImporter::VHandles vhandles;
    VertexHandle           vh;
    OpenMesh::Vec4i        c;  // Color
    float                  tmp;

    _bi.reserve(vertexCount_, 3* vertexCount_ , faceCount_);

    // read vertices:
    for (i = 0; i < vertexCount_ && !_in.eof(); ++i) {
        v[0] = 0.0;
        v[1] = 0.0;
        v[2] = 0.0;

        n[0] = 0.0;
        n[1] = 0.0;
        n[2] = 0.0;

        t[0] = 0.0;
        t[1] = 0.0;

        c[0] = 0;
        c[1] = 0;
        c[2] = 0;
        c[3] = 255;

        for (uint propertyIndex = 0; propertyIndex < vertexPropertyCount_; ++propertyIndex) {
            switch (vertexPropertyMap_[propertyIndex].property) {
            case XCOORD:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, v[0]);
                break;
            case YCOORD:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, v[1]);
                break;
            case ZCOORD:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, v[2]);
                break;
            case XNORM:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, n[0]);
                break;
            case YNORM:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, n[1]);
                break;
            case ZNORM:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, n[2]);
                break;
            case TEXX:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, t[0]);
                break;
            case TEXY:
                readValue(vertexPropertyMap_[propertyIndex].value, _in, t[1]);
                break;
            case COLORRED:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    readValue(vertexPropertyMap_[propertyIndex].value, _in, tmp);

                    c[0] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    readInteger(vertexPropertyMap_[propertyIndex].value, _in, c[0]);

                break;
            case COLORGREEN:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    readValue(vertexPropertyMap_[propertyIndex].value, _in, tmp);
                    c[1] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    readInteger(vertexPropertyMap_[propertyIndex].value, _in, c[1]);

                break;
            case COLORBLUE:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    readValue(vertexPropertyMap_[propertyIndex].value, _in, tmp);
                    c[2] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    readInteger(vertexPropertyMap_[propertyIndex].value, _in, c[2]);

                break;
            case COLORALPHA:
                if (vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT32 ||
                    vertexPropertyMap_[propertyIndex].value == ValueTypeFLOAT) {
                    readValue(vertexPropertyMap_[propertyIndex].value, _in, tmp);
                    c[3] = static_cast<OpenMesh::Vec4i::value_type> (tmp * 255.0f);
                } else
                    readInteger(vertexPropertyMap_[propertyIndex].value, _in, c[3]);

                break;
            default:
                // Read unsupported property
                consume_input(_in, scalar_size_[vertexPropertyMap_[propertyIndex].value]);
                break;
            }

        }

        vh = _bi.add_vertex(v);
        if (_opt.vertex_has_normal())
          _bi.set_normal(vh, n);
        if (_opt.vertex_has_texcoord())
          _bi.set_texcoord(vh, t);
        if (_opt.vertex_has_color())
          _bi.set_color(vh, Vec4uc(c));
    }

    for (i = 0; i < faceCount_; ++i) {
        // Read number of vertices for the current face
        readValue(faceIndexType_, _in, nV);

        if (nV == 3) {
            vhandles.resize(3);
            readInteger(faceEntryType_, _in, j);
            readInteger(faceEntryType_, _in, k);
            readInteger(faceEntryType_, _in, l);

            vhandles[0] = VertexHandle(j);
            vhandles[1] = VertexHandle(k);
            vhandles[2] = VertexHandle(l);
        } else {
            vhandles.clear();
            for (j = 0; j < nV; ++j) {
                readInteger(faceEntryType_, _in, idx);
                vhandles.push_back(VertexHandle(idx));
            }
        }

        _bi.add_face(vhandles);
    }

    return true;
}